

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlacon2.c
# Opt level: O1

int dlacon2_(int *n,double *v,double *x,int *isgn,double *est,int *kase,int *isave)

{
  double dVar1;
  int iVar2;
  doublereal dVar3;
  integer iVar4;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar9;
  integer local_4c;
  undefined1 local_48 [16];
  
  local_48._8_8_ = local_48._0_8_;
  local_4c = 1;
  if (*kase == 0) {
    iVar2 = *n;
    if (0 < (long)iVar2) {
      lVar6 = 0;
      do {
        x[lVar6] = 1.0 / (double)iVar2;
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar4 = idamax_(n,x,&local_4c);
    isave[1] = iVar4 + -1;
    isave[2] = 2;
    goto LAB_0010ff57;
  case 3:
    dcopy_(n,x,&local_4c,v,&local_4c);
    local_48._0_8_ = *est;
    dVar3 = dasum_(n,v,&local_4c);
    *est = dVar3;
    if (0 < (long)*n) {
      lVar6 = 0;
      do {
        if ((*(double *)(&DAT_00113ba0 + (ulong)(x[lVar6] < 0.0) * 8) != (double)isgn[lVar6]) ||
           (NAN(*(double *)(&DAT_00113ba0 + (ulong)(x[lVar6] < 0.0) * 8)) ||
            NAN((double)isgn[lVar6]))) {
          if ((double)local_48._0_8_ < dVar3) {
            if (0 < *n) {
              lVar6 = 0;
              do {
                dVar9 = x[lVar6];
                dVar1 = *(double *)(&DAT_00113ba0 + (ulong)(dVar9 < 0.0) * 8);
                x[lVar6] = dVar1;
                if (dVar9 < 0.0) {
                  dVar9 = floor(0.5 - dVar1);
                  uVar8 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
                  uVar7 = SUB84(dVar9,0);
                }
                else {
                  dVar9 = floor(dVar1 + 0.5);
                  uVar7 = SUB84(dVar9,0);
                  uVar8 = (uint)((ulong)dVar9 >> 0x20);
                }
                isgn[lVar6] = (int)(double)CONCAT44(uVar8,uVar7);
                lVar6 = lVar6 + 1;
              } while (lVar6 < *n);
            }
            *kase = 2;
            *isave = 4;
            return 0;
          }
          break;
        }
        lVar6 = lVar6 + 1;
      } while (*n != lVar6);
    }
LAB_001101c1:
    uVar8 = *n;
    if (0 < (int)uVar8) {
      uVar5 = 0;
      dVar9 = 1.0;
      do {
        x[uVar5] = ((double)(int)uVar5 / (double)(int)(uVar8 - 1) + 1.0) * dVar9;
        dVar9 = -dVar9;
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar2 = isave[1];
    iVar4 = idamax_(n,x,&local_4c);
    isave[1] = iVar4 + -1;
    if (((x[iVar2] == ABS(x[(long)iVar4 + -1])) &&
        (!NAN(x[iVar2]) && !NAN(ABS(x[(long)iVar4 + -1])))) || (4 < isave[2])) goto LAB_001101c1;
    isave[2] = isave[2] + 1;
LAB_0010ff57:
    if (0 < (long)*n) {
      memset(x,0,(long)*n << 3);
    }
    x[isave[1]] = 1.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    dVar3 = dasum_(n,x,&local_4c);
    dVar9 = dVar3 / (double)(*n * 3);
    dVar9 = dVar9 + dVar9;
    if (dVar9 < *est || dVar9 == *est) goto LAB_00110095;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar9;
    local_48._12_4_ = extraout_XMM0_Dd;
    dcopy_(n,x,&local_4c,v,&local_4c);
    break;
  default:
    if (*n != 1) {
      dVar3 = dasum_(n,x,&local_4c);
      *est = dVar3;
      if (0 < *n) {
        lVar6 = 0;
        do {
          dVar9 = x[lVar6];
          dVar1 = *(double *)(&DAT_00113ba0 + (ulong)(dVar9 < 0.0) * 8);
          x[lVar6] = dVar1;
          if (dVar9 < 0.0) {
            dVar9 = floor(0.5 - dVar1);
            uVar8 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
            uVar7 = SUB84(dVar9,0);
          }
          else {
            dVar9 = floor(dVar1 + 0.5);
            uVar7 = SUB84(dVar9,0);
            uVar8 = (uint)((ulong)dVar9 >> 0x20);
          }
          isgn[lVar6] = (int)(double)CONCAT44(uVar8,uVar7);
          lVar6 = lVar6 + 1;
        } while (lVar6 < *n);
      }
      *kase = 2;
      *isave = 2;
      return 0;
    }
    dVar9 = *x;
    *v = dVar9;
    dVar9 = ABS(dVar9);
    local_48._0_4_ = SUB84(dVar9,0);
    local_48._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
  }
  *est = (double)CONCAT44(local_48._4_4_,local_48._0_4_);
LAB_00110095:
  *kase = 0;
  return 0;
}

Assistant:

int
dlacon2_(int *n, double *v, double *x, int *isgn, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    double      zero = 0.0;
    double      one = 1.0;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
#ifdef _CRAY
    extern int ISAMAX(int *, double *, int *);
    extern double SASUM(int *, double *, int *);
    extern int SCOPY(int *, double *, int *, double *, int *);
#else
    extern int idamax_(int *, double *, int *);
    extern double dasum_(int *, double *, int *);
    extern void dcopy_(int *, double *, int *, double *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (double) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = dasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    dcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = dasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (double)(*n * 3) * 2.;
#else
    temp = dasum_(n, x, &c__1) / (double)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	dcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}